

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::mz_zip_get_file_modified_time
                  (char *pFilename,mz_uint16 *pDOS_time,mz_uint16 *pDOS_date)

{
  int iVar1;
  undefined1 local_b8 [8];
  stat64 file_stat;
  mz_uint16 *pDOS_date_local;
  mz_uint16 *pDOS_time_local;
  char *pFilename_local;
  
  file_stat.__glibc_reserved[2] = (__syscall_slong_t)pDOS_date;
  iVar1 = stat64(pFilename,(stat64 *)local_b8);
  if (iVar1 == 0) {
    mz_zip_time_to_dos_time
              (file_stat.st_atim.tv_nsec,pDOS_time,(mz_uint16 *)file_stat.__glibc_reserved[2]);
  }
  pFilename_local._4_4_ = (uint)(iVar1 == 0);
  return pFilename_local._4_4_;
}

Assistant:

static mz_bool mz_zip_get_file_modified_time(const char *pFilename,
                                             mz_uint16 *pDOS_time,
                                             mz_uint16 *pDOS_date) {
#ifdef MINIZ_NO_TIME
  (void)pFilename;
  *pDOS_date = *pDOS_time = 0;
#else
  struct MZ_FILE_STAT_STRUCT file_stat;
  // On Linux with x86 glibc, this call will fail on large files (>= 0x80000000
  // bytes) unless you compiled with _LARGEFILE64_SOURCE. Argh.
  if (MZ_FILE_STAT(pFilename, &file_stat) != 0)
    return MZ_FALSE;
  mz_zip_time_to_dos_time(file_stat.st_mtime, pDOS_time, pDOS_date);
#endif // #ifdef MINIZ_NO_TIME
  return MZ_TRUE;
}